

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-bench.cpp
# Opt level: O3

field_type test::get_field_type(string *field)

{
  int iVar1;
  field_type fVar2;
  
  iVar1 = std::__cxx11::string::compare((char *)field);
  fVar2 = INT;
  if (iVar1 != 0) {
    iVar1 = std::__cxx11::string::compare((char *)field);
    if (iVar1 != 0) {
      iVar1 = std::__cxx11::string::compare((char *)field);
      if (iVar1 != 0) {
        iVar1 = std::__cxx11::string::compare((char *)field);
        if (iVar1 != 0) {
          iVar1 = std::__cxx11::string::compare((char *)field);
          if (iVar1 != 0) {
            iVar1 = std::__cxx11::string::compare((char *)field);
            if (iVar1 != 0) {
              iVar1 = std::__cxx11::string::compare((char *)field);
              if (iVar1 != 0) {
                iVar1 = std::__cxx11::string::compare((char *)field);
                if (iVar1 != 0) {
                  iVar1 = std::__cxx11::string::compare((char *)field);
                  if (iVar1 != 0) {
                    iVar1 = std::__cxx11::string::compare((char *)field);
                    if (iVar1 != 0) {
                      iVar1 = std::__cxx11::string::compare((char *)field);
                      if (iVar1 != 0) {
                        iVar1 = std::__cxx11::string::compare((char *)field);
                        if (iVar1 != 0) {
                          iVar1 = std::__cxx11::string::compare((char *)field);
                          if (iVar1 != 0) {
                            iVar1 = std::__cxx11::string::compare((char *)field);
                            fVar2 = BOOL;
                            if (iVar1 != 0) {
                              iVar1 = std::__cxx11::string::compare((char *)field);
                              if (iVar1 != 0) {
                                iVar1 = std::__cxx11::string::compare((char *)field);
                                if (iVar1 != 0) {
                                  iVar1 = std::__cxx11::string::compare((char *)field);
                                  if (iVar1 != 0) {
                                    iVar1 = std::__cxx11::string::compare((char *)field);
                                    if (iVar1 != 0) {
                                      iVar1 = std::__cxx11::string::compare((char *)field);
                                      if (iVar1 != 0) {
                                        iVar1 = std::__cxx11::string::compare((char *)field);
                                        if (iVar1 == 0) {
                                          fVar2 = FLOAT;
                                        }
                                        else {
                                          iVar1 = std::__cxx11::string::compare((char *)field);
                                          fVar2 = (uint)(iVar1 == 0) * 3;
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return fVar2;
}

Assistant:

static field_type get_field_type(const std::string & field) {
        if (field == "build_number" || field == "n_batch" || field == "n_ubatch" || field == "n_threads" ||
            field == "poll" || field == "model_size" || field == "model_n_params" || field == "n_gpu_layers" ||
            field == "main_gpu" || field == "n_prompt" || field == "n_gen" || field == "avg_ns" ||
            field == "stddev_ns") {
            return INT;
        }
        if (field == "f16_kv" || field == "no_kv_offload" || field == "cpu_strict" || field == "flash_attn" ||
            field == "use_mmap" || field == "embeddings") {
            return BOOL;
        }
        if (field == "avg_ts" || field == "stddev_ts") {
            return FLOAT;
        }
        return STRING;
    }